

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void __thiscall
Qentem::QTest::PrintErrorMessage<Qentem::StringStream<char>,char[20]>
          (QTest *this,bool equal,StringStream<char> *value1,char (*value2) [20],unsigned_long line)

{
  undefined7 in_register_00000031;
  char local_49;
  char *local_48;
  char *local_40;
  unsigned_long line_local;
  
  line_local = line;
  local_48 = TestOutPut::GetColor(ERROR);
  local_40 = TestOutPut::GetColor(END);
  local_49 = '\n';
  TestOutPut::Print<char_const*,char[7],char_const*,char[3],char_const*,char>
            (&local_48,(char (*) [7])"Failed",&local_40,(char (*) [3])0x11c2aa,&this->part_name_,
             &local_49);
  local_48 = " ";
  if ((int)CONCAT71(in_register_00000031,equal) != 0) {
    local_48 = " not ";
  }
  TestOutPut::
  Print<char_const*,char[2],unsigned_long,char[10],char_const*,char[9],char[20],char[19],Qentem::StringStream<char>,char[4]>
            (&this->file_fullname_,(char (*) [2])0x11c8cd,&line_local,(char (*) [10])":\n Should",
             &local_48,(char (*) [9])"equal: `",value2,(char (*) [19])"`\n     Returned: `",value1,
             (char (*) [4])"`\n\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintErrorMessage(bool equal, const Value1_T &value1, const Value2_T &value2,
                                           unsigned long line) {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Failed",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        TestOutPut::Print(file_fullname_, ":", line, ":\n Should", (equal ? " not " : " "), "equal: `", value2,
                          "`\n     Returned: `", value1, "`\n\n");
    }